

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

long __thiscall Alice::ObliviousComparison(Alice *this,string *op,long arg1,long arg2)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  long lVar4;
  long lVar5;
  Message MVar6;
  long local_60;
  long local_58;
  undefined1 local_50 [8];
  Message msg_from_Bob;
  Message msg_for_Bob;
  long beta;
  long arg2_local;
  long arg1_local;
  string *op_local;
  Alice *this_local;
  
  Message::Message((Message *)&msg_from_Bob.scalar2);
  Message::Message((Message *)local_50);
  MVar6 = Server::Receive(this->srv);
  local_60 = MVar6.scalar1;
  local_50 = (undefined1  [8])local_60;
  local_58 = MVar6.scalar2;
  msg_from_Bob.scalar1 = local_58;
  bVar1 = std::operator==(op,">=");
  if (bVar1) {
    lVar4 = arg1 + (long)local_50;
    lVar5 = arg2 + msg_from_Bob.scalar1;
    tVar3 = time((time_t *)0x0);
    srand((uint)tVar3);
    iVar2 = rand();
    msg_from_Bob.scalar2 = (long)(iVar2 % 100);
    Server::Send(this->srv,(Message *)&msg_from_Bob.scalar2);
    msg_for_Bob.scalar2 = (int)(uint)(lVar5 <= lVar4) - msg_from_Bob.scalar2;
  }
  else {
    bVar1 = std::operator==(op,"==");
    if (bVar1) {
      lVar4 = arg1 + (long)local_50;
      lVar5 = arg2 + msg_from_Bob.scalar1;
      tVar3 = time((time_t *)0x0);
      srand((uint)tVar3);
      iVar2 = rand();
      msg_from_Bob.scalar2 = (long)(iVar2 % 100);
      Server::Send(this->srv,(Message *)&msg_from_Bob.scalar2);
      msg_for_Bob.scalar2 = (int)(uint)(lVar4 == lVar5) - msg_from_Bob.scalar2;
    }
  }
  return msg_for_Bob.scalar2;
}

Assistant:

long Alice::ObliviousComparison(std::string op, long arg1, long arg2)
{
    long beta;
    Message msg_for_Bob, msg_from_Bob;
    msg_from_Bob = srv->Receive();
    if(op == ">=")
    {
        beta = ((arg1 + msg_from_Bob.scalar1) >= (arg2 + msg_from_Bob.scalar2) ? 1 : 0);
        srand(time(NULL));		
		msg_for_Bob.scalar1 = rand()%100;
        srv->Send(msg_for_Bob);
        beta = beta - msg_for_Bob.scalar1;                
    }
    else if(op == "==")
    {
        beta = ((arg1 + msg_from_Bob.scalar1) == (arg2 + msg_from_Bob.scalar2) ? 1 : 0);
        srand(time(NULL));		
		msg_for_Bob.scalar1 = rand()%100;
        srv->Send(msg_for_Bob);
        beta = beta - msg_for_Bob.scalar1; 
    }
    return beta;
}